

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void regenerateIndices(void)

{
  long lVar1;
  code *pcVar2;
  pointer ptVar3;
  int iVar4;
  reference pvVar5;
  tvec3<int> local_74;
  tvec3<int> local_68;
  int local_5c;
  int local_58;
  int br;
  int bl;
  int tr;
  int tl;
  int theta_i;
  int phi_i;
  allocator<glm::detail::tvec3<int>_> local_31;
  undefined1 local_30 [8];
  vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> triangles;
  size_t n;
  Perf stat;
  
  Perf::Perf((Perf *)((long)&n + 7),"Regenerate indices");
  triangles.super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (int)phi_n * (int)theta_n;
  std::allocator<glm::detail::tvec3<int>_>::allocator(&local_31);
  std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::vector
            ((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> *)local_30,
             (ulong)(uint)(iVar4 * 2),&local_31);
  std::allocator<glm::detail::tvec3<int>_>::~allocator(&local_31);
  for (tl = 0; pcVar2 = __glewBufferData, (ulong)(long)tl < CONCAT44(phi_n._4_4_,(int)phi_n);
      tl = tl + 1) {
    for (tr = 0; (ulong)(long)tr < CONCAT44(theta_n._4_4_,(int)theta_n); tr = tr + 1) {
      bl = tl * ((int)theta_n + 1) + tr;
      br = bl + 1;
      local_58 = br + (int)theta_n;
      local_5c = local_58 + 1;
      glm::detail::tvec3<int>::tvec3(&local_68,&br,&bl,&local_58);
      ptVar3 = triangles.
               super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      triangles.
      super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(triangles.
                             super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0 + 1);
      pvVar5 = std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::
               operator[]((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                           *)local_30,(size_type)ptVar3);
      glm::detail::tvec3<int>::operator=(pvVar5,&local_68);
      glm::detail::tvec3<int>::tvec3(&local_74,&local_58,&local_5c,&br);
      ptVar3 = triangles.
               super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      triangles.
      super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(triangles.
                             super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0 + 1);
      pvVar5 = std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::
               operator[]((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                           *)local_30,(size_type)ptVar3);
      glm::detail::tvec3<int>::operator=(pvVar5,&local_74);
    }
  }
  lVar1 = (long)triangles.
                super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage * 0xc;
  pvVar5 = std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::
           operator[]((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> *)
                      local_30,0);
  (*pcVar2)(0x8893,lVar1,pvVar5,0x88e8);
  index_count = (long)triangles.
                      super__Vector_base<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage * 3;
  std::vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_>::~vector
            ((vector<glm::detail::tvec3<int>,_std::allocator<glm::detail::tvec3<int>_>_> *)local_30)
  ;
  return;
}

Assistant:

void regenerateIndices() {
    Perf stat("Regenerate indices");
    size_t n = 0;
    vector<ivec3> triangles(uint(phi_n * theta_n * 2));
    for (int phi_i = 0; phi_i < phi_n; phi_i++) {
        for (int theta_i = 0; theta_i < theta_n; theta_i++) {
            int tl = phi_i * (theta_n + 1) + theta_i;
            int tr = tl + 1;
            int bl = tr + theta_n;
            int br = bl + 1;
            triangles[n++] = ivec3(tr, tl, bl);
            triangles[n++] = ivec3(bl, br, tr);
        }
    }

    glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(ivec3), &triangles[0], GL_DYNAMIC_DRAW);

    index_count = n * 3;
}